

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_column_data.cpp
# Opt level: O2

void __thiscall
duckdb::StandardColumnData::UpdateColumn
          (StandardColumnData *this,TransactionData transaction,
          vector<unsigned_long,_true> *column_path,Vector *update_vector,row_t *row_ids,
          idx_t update_count,idx_t depth)

{
  const_reference pvVar1;
  
  if (depth < (ulong)((long)(column_path->
                            super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(column_path->
                            super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3)) {
    ColumnData::UpdateColumn
              (&(this->validity).super_ColumnData,transaction,column_path,update_vector,row_ids,
               update_count,depth);
    return;
  }
  pvVar1 = vector<unsigned_long,_true>::get<true>(column_path,0);
  ColumnData::Update(&this->super_ColumnData,transaction,*pvVar1,update_vector,row_ids,update_count)
  ;
  return;
}

Assistant:

void StandardColumnData::UpdateColumn(TransactionData transaction, const vector<column_t> &column_path,
                                      Vector &update_vector, row_t *row_ids, idx_t update_count, idx_t depth) {
	if (depth >= column_path.size()) {
		// update this column
		ColumnData::Update(transaction, column_path[0], update_vector, row_ids, update_count);
	} else {
		// update the child column (i.e. the validity column)
		validity.UpdateColumn(transaction, column_path, update_vector, row_ids, update_count, depth + 1);
	}
}